

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O3

c_int osqp_update_verbose(OSQPWorkspace *work,c_int verbose_new)

{
  c_int cVar1;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar1 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_verbose");
    return cVar1;
  }
  if (1 < (ulong)verbose_new) {
    printf("ERROR in %s: ","osqp_update_verbose");
    printf("verbose should be either 0 or 1");
    putchar(10);
    return 1;
  }
  work->settings->verbose = verbose_new;
  return 0;
}

Assistant:

c_int osqp_update_verbose(OSQPWorkspace *work, c_int verbose_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that verbose is either 0 or 1
  if ((verbose_new != 0) && (verbose_new != 1)) {
# ifdef PRINTING
    c_eprint("verbose should be either 0 or 1");
# endif /* ifdef PRINTING */
    return 1;
  }

  // Update verbose
  work->settings->verbose = verbose_new;

  return 0;
}